

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

void __thiscall
avro::detail::BufferImpl::writeTo<char>(BufferImpl *this,char val,true_type *param_3)

{
  reference pvVar1;
  size_type sVar2;
  data_type *pdVar3;
  data_type in_SIL;
  size_type in_RDI;
  BufferImpl *unaff_retaddr;
  data_type *in_stack_00000008;
  undefined7 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0xa0) != 0) {
    pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::front
                       ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                        CONCAT17(in_SIL,in_stack_fffffffffffffff0));
    sVar2 = Chunk::freeSize(pvVar1);
    if (sVar2 != 0) {
      pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::front
                         ((deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)
                          CONCAT17(in_SIL,in_stack_fffffffffffffff0));
      pdVar3 = Chunk::tellWritePos(pvVar1);
      *pdVar3 = in_SIL;
      postWrite(unaff_retaddr,in_RDI);
      return;
    }
  }
  writeTo((BufferImpl *)param_3,in_stack_00000008,(size_type)unaff_retaddr);
  return;
}

Assistant:

void writeTo(T val, const boost::true_type&)
    {
        if(freeSpace_ && (sizeof(T) <= writeChunks_.front().freeSize())) {
            // fast path, there's enough room in the writeable chunk to just
            // straight out copy it
            *(reinterpret_cast <T*> ( writeChunks_.front().tellWritePos()) ) = val;
            postWrite(sizeof(T));
        }
        else {
            // need to fixup chunks first, so use the regular memcpy 
            // writeTo method
            writeTo(reinterpret_cast<data_type*>(&val), sizeof(T));
        }
    }